

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

void Mpm_ManPerformRound(Mpm_Man_t *p)

{
  Mig_Fan_t MVar1;
  void *pvVar2;
  int *piVar3;
  int *piVar4;
  void **ppvVar5;
  Mpm_LibLut_t *pMVar6;
  Mpm_Par_t *pMVar7;
  Mig_Obj_t *pMVar8;
  int iVar9;
  int *piVar10;
  Mig_Man_t *pMVar11;
  Mpm_Cut_t *pMVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  Mig_Obj_t *pMVar21;
  timespec ts;
  
  iVar9 = clock_gettime(3,(timespec *)&ts);
  if (iVar9 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pMVar11 = p->pMig;
  if ((p->vMigRefs).nSize != (pMVar11->vRefs).nSize) {
    __assert_fail("Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x32d,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  memcpy((p->vMigRefs).pArray,(pMVar11->vRefs).pArray,(long)pMVar11->nObjs << 2);
  pMVar11 = p->pMig;
  if (0 < (pMVar11->vCos).nSize) {
    lVar13 = 0;
    do {
      if ((pMVar11->vCos).nSize <= lVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar16 = (pMVar11->vCos).pArray[lVar13];
      if (((int)uVar16 < 0) || (pMVar11->nObjs <= (int)uVar16)) goto LAB_00409223;
      if ((pMVar11->vPages).nSize <= (int)(uVar16 >> 0xc)) goto LAB_00409242;
      pvVar2 = (pMVar11->vPages).pArray[uVar16 >> 0xc];
      if (pvVar2 == (void *)0x0) break;
      uVar14 = (ulong)((uVar16 & 0xfff) << 4);
      uVar19 = *(uint *)((long)pvVar2 + uVar14 + 0xc) >> 1;
      uVar16 = *(uint *)((long)pvVar2 + uVar14) >> 1;
      if (uVar19 <= uVar16) {
        __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                      ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
      }
      lVar17 = *(long *)((long)pvVar2 + (uVar14 - ((uVar19 & 0xfff) << 4)) + -0x10);
      if (*(int *)(lVar17 + 8) <= (int)uVar16) goto LAB_00409223;
      uVar19 = *(uint *)((long)pvVar2 + uVar14) >> 0xd;
      if (*(int *)(lVar17 + 0x1c) <= (int)uVar19) goto LAB_00409242;
      uVar16 = *(uint *)(*(long *)(*(long *)(lVar17 + 0x20) + (ulong)uVar19 * 8) + 0xc +
                        (ulong)((uVar16 & 0xfff) << 4)) >> 1;
      if ((p->vMigRefs).nSize <= (int)uVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar3 = (p->vMigRefs).pArray + uVar16;
      *piVar3 = *piVar3 + -1;
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pMVar11->vCos).nSize);
  }
  p->nCutsMerged = 0;
  pMVar11->iPage = 0;
  pMVar11 = p->pMig;
  uVar16 = pMVar11->iPage;
  while ((int)uVar16 < (pMVar11->vPages).nSize) {
    if ((int)uVar16 < 0) goto LAB_00409242;
    pMVar21 = (Mig_Obj_t *)(pMVar11->vPages).pArray[uVar16];
    pMVar11->pPage = pMVar21;
    if (pMVar21 == (Mig_Obj_t *)0x0) break;
    MVar1 = pMVar21->pFans[3];
    while ((uint)MVar1 < 0xfffffffe) {
      if ((uint)pMVar21->pFans[1] < 0xfffffffe) {
        Mpm_ManDeriveCuts(p,pMVar21);
      }
      pMVar8 = pMVar21 + 1;
      pMVar21 = pMVar21 + 1;
      MVar1 = pMVar8->pFans[3];
    }
    pMVar11 = p->pMig;
    uVar16 = pMVar11->iPage + 1;
    pMVar11->iPage = uVar16;
  }
  iVar9 = (pMVar11->vCis).nSize;
  if (iVar9 + pMVar11->nObjs + ~((pMVar11->vCos).nSize + iVar9) != p->pManCuts->nEntries) {
    __assert_fail("Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x335,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  piVar3 = (p->vMapRefs).pArray;
  piVar4 = (p->vRequireds).pArray;
  p->GloArea = 0;
  p->GloEdge = 0;
  lVar13 = (long)(pMVar11->vCos).nSize;
  if (lVar13 < 1) {
    iVar9 = 0;
  }
  else {
    lVar17 = 0;
    iVar9 = 0;
    do {
      uVar16 = (pMVar11->vCos).pArray[lVar17];
      if (((int)uVar16 < 0) || (pMVar11->nObjs <= (int)uVar16)) goto LAB_00409223;
      if ((pMVar11->vPages).nSize <= (int)(uVar16 >> 0xc)) goto LAB_00409242;
      pvVar2 = (pMVar11->vPages).pArray[uVar16 >> 0xc];
      if (pvVar2 == (void *)0x0) break;
      iVar20 = (p->vTimes).pArray[*(uint *)((long)pvVar2 + (ulong)((uVar16 & 0xfff) << 4)) >> 1];
      if (iVar9 <= iVar20) {
        iVar9 = iVar20;
      }
      lVar17 = lVar17 + 1;
    } while (lVar13 != lVar17);
  }
  p->GloRequired = iVar9;
  iVar20 = p->pPars->DelayTarget;
  if (iVar20 != -1) {
    if (iVar20 < iVar9) {
      iVar20 = iVar9;
    }
    p->GloRequired = iVar20;
  }
  uVar16 = pMVar11->nObjs;
  if ((p->vMapRefs).nCap < (int)uVar16) {
    if (piVar3 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar16 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar3,(long)(int)uVar16 << 2);
    }
    (p->vMapRefs).pArray = piVar10;
    if (piVar10 == (int *)0x0) goto LAB_004092fc;
    (p->vMapRefs).nCap = uVar16;
  }
  if (0 < (int)uVar16) {
    memset((p->vMapRefs).pArray,0,(ulong)uVar16 * 4);
  }
  (p->vMapRefs).nSize = uVar16;
  uVar16 = p->pMig->nObjs;
  if ((p->vRequireds).nCap < (int)uVar16) {
    piVar10 = (p->vRequireds).pArray;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar16 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar16 << 2);
    }
    (p->vRequireds).pArray = piVar10;
    if (piVar10 == (int *)0x0) {
LAB_004092fc:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRequireds).nCap = uVar16;
  }
  if (0 < (int)uVar16) {
    piVar10 = (p->vRequireds).pArray;
    uVar14 = 0;
    do {
      piVar10[uVar14] = 1000000000;
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
  }
  (p->vRequireds).nSize = uVar16;
  pMVar11 = p->pMig;
  iVar9 = (pMVar11->vPages).nSize;
  uVar16 = iVar9 - 1;
  pMVar11->iPage = uVar16;
  if (0 < iVar9) {
    do {
      iVar9 = (pMVar11->vPages).nSize;
      if (iVar9 <= (int)uVar16) {
LAB_00409242:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar5 = (pMVar11->vPages).pArray;
      pMVar21 = (Mig_Obj_t *)ppvVar5[uVar16];
      pMVar11->pPage = pMVar21;
      if (pMVar21 == (Mig_Obj_t *)0x0) break;
      if (uVar16 == iVar9 - 1U) {
        if (pMVar11->nObjs < 1) {
LAB_00409223:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                        ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
        }
        uVar19 = pMVar11->nObjs - 1;
        uVar16 = uVar19 >> 0xc;
        if (iVar9 <= (int)uVar16) goto LAB_00409242;
        pMVar21 = (Mig_Obj_t *)((ulong)((uVar19 & 0xfff) << 4) + (long)ppvVar5[uVar16]);
      }
      else {
        pMVar21 = pMVar21 + 0xfff;
      }
      for (; -1 < (long)pMVar21 - (long)p->pMig->pPage; pMVar21 = pMVar21 + -1) {
        if ((uint)pMVar21->pFans[1] < 0xfffffffe) {
          uVar16 = (uint)pMVar21->pFans[3] >> 1;
          iVar9 = piVar4[uVar16];
          if (iVar9 < 1) {
            __assert_fail("Required > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                          ,0x2c2,"void Mpm_ManFinalizeRound(Mpm_Man_t *)");
          }
          if (0 < piVar3[uVar16]) {
            pMVar12 = Mpm_ObjCutBestP(p,pMVar21);
            pMVar6 = p->pLibLut;
            uVar16 = *(uint *)&pMVar12->field_0x4;
            uVar19 = uVar16 >> 0x1b;
            uVar14 = (ulong)uVar19;
            if (0x7ffffff < uVar16) {
              uVar18 = 0;
              do {
                if (pMVar12->pLeaves[uVar18] < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                uVar16 = (uint)pMVar12->pLeaves[uVar18] >> 1;
                iVar20 = iVar9 - pMVar6->pLutDelays[uVar19][uVar18];
                if (piVar4[uVar16] < iVar20) {
                  iVar20 = piVar4[uVar16];
                }
                piVar4[uVar16] = iVar20;
                piVar3[uVar16] = piVar3[uVar16] + 1;
                uVar18 = uVar18 + 1;
                uVar16 = *(uint *)&pMVar12->field_0x4;
                uVar14 = (ulong)(uVar16 >> 0x1b);
              } while (uVar18 < uVar14);
            }
            pMVar7 = p->pPars;
            if (pMVar7->fMap4Cnf == 0) {
              if (pMVar7->fMap4Aig != 0) {
                iVar9 = *(int *)((long)&p->pDsd6->nAnds + (ulong)((uVar16 & 0x1fffffe) << 4));
                goto LAB_004090aa;
              }
              iVar9 = 0x14;
              if (pMVar7->fMap4Gates == 0) {
                iVar9 = pMVar6->pLutAreas[uVar14];
              }
            }
            else {
              iVar9 = *(int *)((long)&p->pDsd6->nClauses + (ulong)((uVar16 & 0x1fffffe) << 4));
LAB_004090aa:
              iVar9 = iVar9 * 0x14;
            }
            p->GloArea = p->GloArea + (long)iVar9;
            p->GloEdge = p->GloEdge + (ulong)(*(uint *)&pMVar12->field_0x4 >> 0x1b);
          }
        }
        else if (((uint)pMVar21->pFans[2] < 0xfffffffe) &&
                ((uint)pMVar21->pFans[0] >> 1 < 0x7fffffff)) {
          piVar4[(uint)pMVar21->pFans[0] >> 1] = p->GloRequired;
          piVar3[(uint)pMVar21->pFans[0] >> 1] = piVar3[(uint)pMVar21->pFans[0] >> 1] + 1;
        }
      }
      piVar10 = &p->pMig->iPage;
      *piVar10 = *piVar10 + -1;
      pMVar11 = p->pMig;
      uVar16 = pMVar11->iPage;
    } while (-1 < (int)uVar16);
  }
  uVar14 = p->GloArea / 0x14;
  p->GloArea = uVar14;
  if (p->pPars->fVerbose != 0) {
    if (p->vTtMem == (Vec_Mem_t *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = (ulong)(uint)p->vTtMem->nEntries;
    }
    printf("Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ",
           (ulong)(uint)p->GloRequired,uVar14,(ulong)(uint)p->GloEdge,(ulong)(uint)p->nCutsMerged,
           (ulong)(uint)p->pManCuts->nEntriesMax,uVar18,(ulong)(uint)p->nSmallSupp);
    iVar20 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar20,"%s =","Time");
    Abc_Print(iVar20,"%9.2f sec\n",(double)(lVar13 + lVar15) / 1000000.0);
  }
  return;
}

Assistant:

void Mpm_ManPerformRound( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    abctime clk = Abc_Clock();
    int i;
    // copy references
    assert( Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs) );
    memcpy( Vec_IntArray(&p->vMigRefs), Vec_IntArray(&p->pMig->vRefs), sizeof(int) * Mig_ManObjNum(p->pMig) );
    Mig_ManForEachCo( p->pMig, pObj, i )
        Mig_ObjMigRefDec( p, Mig_ObjFanin0(pObj) );
    // derive cuts
    p->nCutsMerged = 0;
    Mig_ManForEachNode( p->pMig, pObj )
        Mpm_ManDeriveCuts( p, pObj );
    assert( Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries );
    Mpm_ManFinalizeRound( p );
    // report results
    if ( p->pPars->fVerbose )
    {
    printf( "Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ", 
        p->GloRequired, (int)p->GloArea, (int)p->GloEdge, 
        p->nCutsMerged, p->pManCuts->nEntriesMax, 
        p->vTtMem ? p->vTtMem->nEntries : 0, p->nSmallSupp );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}